

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O1

void __thiscall HEkk::initialiseLpRowCost(HEkk *this)

{
  pointer pdVar1;
  pointer pdVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (long)(this->lp_).num_row_;
  if (0 < lVar3) {
    lVar4 = (long)(this->lp_).num_col_;
    lVar3 = lVar3 + lVar4;
    pdVar1 = (this->info_).workCost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (this->info_).workShift_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      pdVar1[lVar4] = 0.0;
      pdVar2[lVar4] = 0.0;
      lVar4 = lVar4 + 1;
    } while (lVar4 < lVar3);
  }
  return;
}

Assistant:

void HEkk::initialiseLpRowCost() {
  for (HighsInt iCol = lp_.num_col_; iCol < lp_.num_col_ + lp_.num_row_;
       iCol++) {
    info_.workCost_[iCol] = 0;
    info_.workShift_[iCol] = 0;
  }
}